

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O0

void Js::ByteCodeDumper::
     DumpReg1Unsigned1<Js::OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
               (OpCode op,OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  RegexPattern *this;
  undefined1 local_1030 [8];
  DebugWriter w;
  ByteCodeReader *reader_local;
  FunctionBody *dumpFunction_local;
  OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *data_local;
  OpCode op_local;
  
  w._4096_8_ = reader;
  if (op == NewRegEx) {
    DumpReg(data->R0);
    Output::Print(L"=");
    UnifiedRegex::DebugWriter::DebugWriter((DebugWriter *)local_1030);
    this = FunctionBody::GetLiteralRegex(dumpFunction,(uint)data->C1);
    UnifiedRegex::RegexPattern::Print(this,(DebugWriter *)local_1030);
  }
  else if (op == InitForInEnumerator) {
    DumpReg(data->R0);
    DumpU4((uint)data->C1);
  }
  else {
    if (op != InvalCachedScope) {
      if (op == NewPropIdArrForCompProps) {
        Output::Print(L" R%u = [%u] ",(ulong)data->R0,(ulong)data->C1);
        return;
      }
      if (op != NewScopeSlots) {
        DumpReg(data->R0);
        Output::Print(L"=");
        DumpU4((uint)data->C1);
        return;
      }
    }
    Output::Print(L" R%u[%u]",(ulong)data->R0,(ulong)data->C1);
  }
  return;
}

Assistant:

void ByteCodeDumper::DumpReg1Unsigned1(OpCode op, const unaligned T* data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case OpCode::InvalCachedScope:
#if ENABLE_NATIVE_CODEGEN
            case OpCode::NewScopeSlots:
#endif
                Output::Print(_u(" R%u[%u]"), data->R0, data->C1);
                break;
            case OpCode::NewRegEx:
            {
                DumpReg(data->R0);
#if DBG
                Output::Print(_u("="));
                UnifiedRegex::DebugWriter w;
                dumpFunction->GetLiteralRegex(data->C1)->Print(&w);
#else
                Output::Print(_u("=<regex>"));
#endif
                break;
            }
            case OpCode::InitForInEnumerator:
            {
                DumpReg(data->R0);
                DumpU4(data->C1);
                break;
            }
            case OpCode::NewPropIdArrForCompProps:
            {
                Output::Print(_u(" R%u = [%u] "), data->R0, data->C1);
                break;
            }
            default:
                DumpReg(data->R0);
                Output::Print(_u("="));
                DumpU4(data->C1);
                break;
        };
    }